

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConst(BinaryWriterSpec *this,Const *const_)

{
  Stream *pSVar1;
  int iVar2;
  byte bVar3;
  unsigned_short uVar4;
  Enum EVar5;
  uint32_t uVar6;
  ExpectedNan EVar7;
  int iVar8;
  uint uVar9;
  uint64_t uVar10;
  uintptr_t uVar11;
  char *s;
  unsigned_long uVar12;
  Type local_54;
  int local_4c;
  Type TStack_48;
  int lane;
  string local_40;
  Type local_20;
  Const *local_18;
  Const *const__local;
  BinaryWriterSpec *this_local;
  
  local_18 = const_;
  const__local = (Const *)this;
  Stream::Writef(this->json_stream_,"{");
  WriteKey(this,"type");
  local_20 = Const::type(local_18);
  EVar5 = Type::operator_cast_to_Enum(&local_20);
  switch(EVar5) {
  case ExternRef:
    WriteString(this,"externref");
    WriteSeparator(this);
    WriteKey(this,"value");
    uVar11 = Const::ref_bits(local_18);
    WriteRefBits(this,uVar11);
    break;
  case FuncRef:
    WriteString(this,"funcref");
    WriteSeparator(this);
    WriteKey(this,"value");
    uVar11 = Const::ref_bits(local_18);
    WriteRefBits(this,uVar11);
    break;
  default:
    abort();
  case V128:
    WriteString(this,"v128");
    WriteSeparator(this);
    WriteKey(this,"lane_type");
    TStack_48 = Const::lane_type(local_18);
    Type::GetName_abi_cxx11_(&local_40,&stack0xffffffffffffffb8);
    s = (char *)std::__cxx11::string::c_str();
    WriteString(this,s);
    std::__cxx11::string::~string((string *)&local_40);
    WriteSeparator(this);
    WriteKey(this,"value");
    Stream::Writef(this->json_stream_,"[");
    for (local_4c = 0; iVar2 = local_4c, iVar8 = Const::lane_count(local_18), iVar2 < iVar8;
        local_4c = local_4c + 1) {
      local_54 = Const::lane_type(local_18);
      EVar5 = Type::operator_cast_to_Enum(&local_54);
      switch(EVar5) {
      case I16:
        pSVar1 = this->json_stream_;
        uVar4 = Const::v128_lane<unsigned_short>(local_18,local_4c);
        Stream::Writef(pSVar1,"\"%u\"",(ulong)uVar4);
        break;
      case I8:
        pSVar1 = this->json_stream_;
        bVar3 = Const::v128_lane<unsigned_char>(local_18,local_4c);
        Stream::Writef(pSVar1,"\"%u\"",(ulong)bVar3);
        break;
      default:
        abort();
      case F64:
        uVar12 = Const::v128_lane<unsigned_long>(local_18,local_4c);
        EVar7 = Const::expected_nan(local_18,local_4c);
        WriteF64(this,uVar12,EVar7);
        break;
      case F32:
        uVar9 = Const::v128_lane<unsigned_int>(local_18,local_4c);
        EVar7 = Const::expected_nan(local_18,local_4c);
        WriteF32(this,uVar9,EVar7);
        break;
      case I64:
        pSVar1 = this->json_stream_;
        uVar12 = Const::v128_lane<unsigned_long>(local_18,local_4c);
        Stream::Writef(pSVar1,"\"%lu\"",uVar12);
        break;
      case I32:
        pSVar1 = this->json_stream_;
        uVar9 = Const::v128_lane<unsigned_int>(local_18,local_4c);
        Stream::Writef(pSVar1,"\"%u\"",(ulong)uVar9);
      }
      iVar2 = local_4c;
      iVar8 = Const::lane_count(local_18);
      if (iVar2 != iVar8 + -1) {
        WriteSeparator(this);
      }
    }
    Stream::Writef(this->json_stream_,"]");
    break;
  case F64:
    WriteString(this,"f64");
    WriteSeparator(this);
    WriteKey(this,"value");
    uVar10 = Const::f64_bits(local_18);
    EVar7 = Const::expected_nan(local_18,0);
    WriteF64(this,uVar10,EVar7);
    break;
  case F32:
    WriteString(this,"f32");
    WriteSeparator(this);
    WriteKey(this,"value");
    uVar6 = Const::f32_bits(local_18);
    EVar7 = Const::expected_nan(local_18,0);
    WriteF32(this,uVar6,EVar7);
    break;
  case I64:
    WriteString(this,"i64");
    WriteSeparator(this);
    WriteKey(this,"value");
    pSVar1 = this->json_stream_;
    uVar10 = Const::u64(local_18);
    Stream::Writef(pSVar1,"\"%lu\"",uVar10);
    break;
  case I32:
    WriteString(this,"i32");
    WriteSeparator(this);
    WriteKey(this,"value");
    pSVar1 = this->json_stream_;
    uVar6 = Const::u32(local_18);
    Stream::Writef(pSVar1,"\"%u\"",(ulong)uVar6);
  }
  Stream::Writef(this->json_stream_,"}");
  return;
}

Assistant:

void BinaryWriterSpec::WriteConst(const Const& const_) {
  json_stream_->Writef("{");
  WriteKey("type");

  /* Always write the values as strings, even though they may be representable
   * as JSON numbers. This way the formatting is consistent. */
  switch (const_.type()) {
    case Type::I32:
      WriteString("i32");
      WriteSeparator();
      WriteKey("value");
      json_stream_->Writef("\"%u\"", const_.u32());
      break;

    case Type::I64:
      WriteString("i64");
      WriteSeparator();
      WriteKey("value");
      json_stream_->Writef("\"%" PRIu64 "\"", const_.u64());
      break;

    case Type::F32:
      WriteString("f32");
      WriteSeparator();
      WriteKey("value");
      WriteF32(const_.f32_bits(), const_.expected_nan());
      break;

    case Type::F64:
      WriteString("f64");
      WriteSeparator();
      WriteKey("value");
      WriteF64(const_.f64_bits(), const_.expected_nan());
      break;

    case Type::FuncRef: {
      WriteString("funcref");
      WriteSeparator();
      WriteKey("value");
      WriteRefBits(const_.ref_bits());
      break;
    }

    case Type::ExternRef: {
      WriteString("externref");
      WriteSeparator();
      WriteKey("value");
      WriteRefBits(const_.ref_bits());
      break;
    }

    case Type::V128: {
      WriteString("v128");
      WriteSeparator();
      WriteKey("lane_type");
      WriteString(const_.lane_type().GetName().c_str());
      WriteSeparator();
      WriteKey("value");
      json_stream_->Writef("[");

      for (int lane = 0; lane < const_.lane_count(); ++lane) {
        switch (const_.lane_type()) {
          case Type::I8:
            json_stream_->Writef("\"%u\"", const_.v128_lane<uint8_t>(lane));
            break;

          case Type::I16:
            json_stream_->Writef("\"%u\"", const_.v128_lane<uint16_t>(lane));
            break;

          case Type::I32:
            json_stream_->Writef("\"%u\"", const_.v128_lane<uint32_t>(lane));
            break;

          case Type::I64:
            json_stream_->Writef("\"%" PRIu64 "\"",
                                 const_.v128_lane<uint64_t>(lane));
            break;

          case Type::F32:
            WriteF32(const_.v128_lane<uint32_t>(lane),
                     const_.expected_nan(lane));
            break;

          case Type::F64:
            WriteF64(const_.v128_lane<uint64_t>(lane),
                     const_.expected_nan(lane));
            break;

          default:
            WABT_UNREACHABLE;
        }

        if (lane != const_.lane_count() - 1) {
          WriteSeparator();
        }
      }

      json_stream_->Writef("]");

      break;
    }

    default:
      WABT_UNREACHABLE;
  }

  json_stream_->Writef("}");
}